

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariantanimation.cpp
# Opt level: O1

QVariant * __thiscall
QVariantAnimation::currentValue(QVariant *__return_storage_ptr__,QVariantAnimation *this)

{
  QVariantAnimationPrivate *this_00;
  
  this_00 = *(QVariantAnimationPrivate **)(this + 8);
  if (*(ulong *)&(this_00->currentValue).d.field_0x18 < 4) {
    QVariantAnimationPrivate::recalculateCurrentInterval(this_00,false);
  }
  ::QVariant::QVariant(__return_storage_ptr__,&this_00->currentValue);
  return __return_storage_ptr__;
}

Assistant:

QVariant QVariantAnimation::currentValue() const
{
    Q_D(const QVariantAnimation);
    if (!d->currentValue.isValid())
        const_cast<QVariantAnimationPrivate*>(d)->recalculateCurrentInterval();
    return d->currentValue;
}